

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashUtils.hpp
# Opt level: O0

void __thiscall
Diligent::HashCombiner<Diligent::DefaultHasher,_Diligent::ShaderResourceVariableDesc>::operator()
          (HashCombiner<Diligent::DefaultHasher,_Diligent::ShaderResourceVariableDesc> *this,
          ShaderResourceVariableDesc *VarDesc)

{
  ushort uVar1;
  uint local_1c;
  ShaderResourceVariableDesc *local_18;
  ShaderResourceVariableDesc *VarDesc_local;
  HashCombiner<Diligent::DefaultHasher,_Diligent::ShaderResourceVariableDesc> *this_local;
  
  uVar1._0_1_ = VarDesc->Type;
  uVar1._1_1_ = VarDesc->Flags;
  local_1c = (uint)uVar1;
  local_18 = VarDesc;
  VarDesc_local = (ShaderResourceVariableDesc *)this;
  DefaultHasher::operator()
            ((this->super_HashCombinerBase<Diligent::DefaultHasher>).m_Hasher,&VarDesc->Name,
             &VarDesc->ShaderStages,&local_1c);
  return;
}

Assistant:

void operator()(const ShaderResourceVariableDesc& VarDesc) const
    {
        ASSERT_SIZEOF(VarDesc.Type, 1, "Hash logic below may be incorrect.");
        ASSERT_SIZEOF(VarDesc.Flags, 1, "Hash logic below may be incorrect.");

        this->m_Hasher(
            VarDesc.Name,
            VarDesc.ShaderStages,
            ((static_cast<uint32_t>(VarDesc.Type) << 0u) |
             (static_cast<uint32_t>(VarDesc.Flags) << 8u)));
        ASSERT_SIZEOF64(VarDesc, 16, "Did you add new members to ShaderResourceVariableDesc? Please handle them here.");
    }